

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O1

void SharpYUVFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ulong uVar5;
  int iVar6;
  
  if (0 < len) {
    uVar5 = 0;
    do {
      sVar1 = A[uVar5];
      sVar2 = A[uVar5 + 1];
      sVar3 = B[uVar5];
      sVar4 = B[uVar5 + 1];
      iVar6 = (uint)best_y[uVar5 * 2] +
              (sVar1 * 9 + (int)sVar4 + ((int)sVar3 + (int)sVar2) * 3 + 8 >> 4);
      if (0x3fe < iVar6) {
        iVar6 = 0x3ff;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      out[uVar5 * 2] = (uint16_t)iVar6;
      iVar6 = (uint)best_y[uVar5 * 2 + 1] +
              (sVar2 * 9 + (int)sVar3 + ((int)sVar4 + (int)sVar1) * 3 + 8 >> 4);
      if (0x3fe < iVar6) {
        iVar6 = 0x3ff;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      out[uVar5 * 2 + 1] = (uint16_t)iVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out) {
  int i;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}